

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

void __thiscall ConsoleInput::ConsoleInput(ConsoleInput *this)

{
  ConsoleInput *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::mutex::mutex(&this->input_mutex);
  this->awaiting_processing = false;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (&this->input,0x800);
  return;
}

Assistant:

ConsoleInput() {
		input.reserve(INPUT_BUFFER_SIZE);
	}